

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

unsigned_long __thiscall v128::To<unsigned_long>(v128 *this,int lane)

{
  unsigned_long local_20;
  unsigned_long result;
  v128 *pvStack_10;
  int lane_local;
  v128 *this_local;
  
  result._4_4_ = lane;
  pvStack_10 = this;
  if ((ulong)((long)(lane + 1) * 8) < 0x11) {
    wabt::MemcpyEndianAware(&local_20,this,8,0x10,0,(long)lane << 3,8);
    return local_20;
  }
  __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/common.h"
                ,0x8b,"T v128::To(int) const [T = unsigned long]");
}

Assistant:

T To(int lane) const {
    static_assert(sizeof(T) <= sizeof(v), "Invalid cast!");
    assert((lane + 1) * sizeof(T) <= sizeof(v));
    T result;
    wabt::MemcpyEndianAware(&result, v, sizeof(result), sizeof(v), 0,
                            lane * sizeof(T), sizeof(result));
    return result;
  }